

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eeyore_optim_commonexp.cpp
# Opt level: O0

void __thiscall persistent_umap<ee_lval,_int>::restore(persistent_umap<ee_lval,_int> *this,int at)

{
  int iVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  int *piVar5;
  mapped_type *pmVar6;
  int local_18;
  int i;
  int at_local;
  persistent_umap<ee_lval,_int> *this_local;
  
  sVar3 = std::
          vector<std::pair<ee_lval,_std::optional<int>_>,_std::allocator<std::pair<ee_lval,_std::optional<int>_>_>_>
          ::size(&this->record);
  local_18 = (int)sVar3;
  while (local_18 = local_18 + -1, at <= local_18) {
    pvVar4 = std::
             vector<std::pair<ee_lval,_std::optional<int>_>,_std::allocator<std::pair<ee_lval,_std::optional<int>_>_>_>
             ::operator[](&this->record,(long)local_18);
    bVar2 = std::optional::operator_cast_to_bool((optional *)&pvVar4->second);
    if (bVar2) {
      pvVar4 = std::
               vector<std::pair<ee_lval,_std::optional<int>_>,_std::allocator<std::pair<ee_lval,_std::optional<int>_>_>_>
               ::operator[](&this->record,(long)local_18);
      piVar5 = std::optional<int>::operator*(&pvVar4->second);
      iVar1 = *piVar5;
      pvVar4 = std::
               vector<std::pair<ee_lval,_std::optional<int>_>,_std::allocator<std::pair<ee_lval,_std::optional<int>_>_>_>
               ::operator[](&this->record,(long)local_18);
      pmVar6 = std::
               unordered_map<ee_lval,_int,_std::hash<ee_lval>,_std::equal_to<ee_lval>,_std::allocator<std::pair<const_ee_lval,_int>_>_>
               ::operator[](&this->map,&pvVar4->first);
      *pmVar6 = iVar1;
    }
    else {
      pvVar4 = std::
               vector<std::pair<ee_lval,_std::optional<int>_>,_std::allocator<std::pair<ee_lval,_std::optional<int>_>_>_>
               ::operator[](&this->record,(long)local_18);
      std::
      unordered_map<ee_lval,_int,_std::hash<ee_lval>,_std::equal_to<ee_lval>,_std::allocator<std::pair<const_ee_lval,_int>_>_>
      ::erase(&this->map,&pvVar4->first);
    }
  }
  return;
}

Assistant:

inline void restore(int at) {
    for(int i = (int)record.size() - 1; i >= at; --i) {
      if(record[i].second) map[record[i].first] = *record[i].second;
      else map.erase(record[i].first);
    }
  }